

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::Image::makeMask(Image *this)

{
  int32 iVar1;
  int local_38;
  int local_34;
  int32 x;
  int32 y;
  uint8 *p;
  uint8 *line;
  int32 i;
  int32 pallen;
  int32 maxcol;
  Image *this_local;
  
  switch(this->depth) {
  case 4:
  case 8:
    iVar1 = this->depth;
    for (line._4_4_ = 0; line._4_4_ < 1 << ((byte)iVar1 & 0x1f); line._4_4_ = line._4_4_ + 1) {
      i = (int32)this->palette[line._4_4_ << 2];
      if ((uint)i < (uint)this->palette[line._4_4_ * 4 + 1]) {
        i = (int32)this->palette[line._4_4_ * 4 + 1];
      }
      if ((uint)i < (uint)this->palette[line._4_4_ * 4 + 2]) {
        i._0_1_ = this->palette[line._4_4_ * 4 + 2];
      }
      this->palette[line._4_4_ * 4 + 3] = (byte)i;
    }
    break;
  case 0x10:
  case 0x18:
    convertTo32(this);
  case 0x20:
    p = this->pixels;
    for (local_34 = 0; local_34 < this->height; local_34 = local_34 + 1) {
      _x = p;
      for (local_38 = 0; local_38 < this->width; local_38 = local_38 + 1) {
        i = (int32)*_x;
        if ((uint)i < (uint)_x[1]) {
          i = (int32)_x[1];
        }
        if ((uint)i < (uint)_x[2]) {
          i._0_1_ = _x[2];
        }
        _x[3] = (byte)i;
        _x = _x + this->bpp;
      }
      p = p + this->stride;
    }
  }
  return;
}

Assistant:

void
Image::makeMask(void)
{
	int32 maxcol;
	switch(this->depth){
	case 4:
	case 8: {
		assert(this->palette);
		int32 pallen = 1 << this->depth;
		for(int32 i = 0; i < pallen; i++){
			maxcol = this->palette[i*4+0];
			if(this->palette[i*4+1] > maxcol) maxcol = this->palette[i*4+1];
			if(this->palette[i*4+2] > maxcol) maxcol = this->palette[i*4+2];
			this->palette[i*4+3] = maxcol;
		}
		break;
	}

	case 16:
	case 24:
		this->convertTo32();
		// fallthrough

	case 32: {
		assert(this->pixels);
		uint8 *line = this->pixels;
		uint8 *p;
		for(int32 y = 0; y < this->height; y++){
			p = line;
			for(int32 x = 0; x < this->width; x++){
				maxcol = p[0];
				if(p[1] > maxcol) maxcol = p[1];
				if(p[2] > maxcol) maxcol = p[2];
				p[3] = maxcol;
				p += this->bpp;
			}
			line += this->stride;
		}
		break;
	}
	}
}